

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatRegister
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t regId)

{
  char in_CL;
  uint32_t in_stack_00000028;
  uint32_t in_stack_00000038;
  FormatFlags in_stack_0000003c;
  BaseEmitter *in_stack_00000040;
  FormatFlags in_stack_0000004c;
  String *in_stack_00000050;
  uint32_t in_stack_000001f0;
  uint32_t in_stack_000001f8;
  bool local_36;
  bool local_34;
  bool local_31;
  Error local_c;
  
  local_31 = in_CL == '\x01' || in_CL == '\x02';
  if (local_31) {
    local_c = x86::FormatterInternal::formatRegister
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040,
                         in_stack_0000003c._3_1_,in_stack_0000003c._2_1_,in_stack_00000038);
  }
  else {
    local_34 = true;
    if (in_CL != '\x05' && in_CL != '\v') {
      local_34 = in_CL == '\a' || in_CL == '\r';
    }
    local_36 = true;
    if (!local_34) {
      local_36 = in_CL == '\x06' || in_CL == '\f';
    }
    if (local_36) {
      local_c = arm::FormatterInternal::formatRegister
                          ((String *)in_stack_00000040,in_stack_0000003c,(BaseEmitter *)sb,
                           formatFlags._3_1_,formatFlags._2_1_,in_stack_00000028,in_stack_000001f0,
                           in_stack_000001f8);
    }
    else {
      local_c = 4;
    }
  }
  return local_c;
}

Assistant:

Error formatRegister(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t regId) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatRegister(sb, formatFlags, emitter, arch, regType, regId);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatRegister(sb, formatFlags, emitter, arch, regType, regId);
#endif

  return kErrorInvalidArch;
}